

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sampler.cpp
# Opt level: O0

Vector3 __thiscall pm::Sampler::sampleHemisphere(Sampler *this,unsigned_long *count,int *jump)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  uint32_t uVar5;
  reference pvVar6;
  reference other;
  int *in_RCX;
  undefined8 extraout_XMM0_Qa;
  float in_XMM1_Da;
  Vector3 VVar7;
  int *jump_local;
  unsigned_long *count_local;
  Sampler *this_local;
  
  uVar3 = *(ulong *)jump;
  uVar4 = numSamples((Sampler *)count);
  if (uVar3 % (ulong)uVar4 == 0) {
    uVar5 = Random::integer((Random *)(count + 0xf),0,(uint32_t)count[2]);
    *in_RCX = uVar5 * *(int *)((long)count + 0xc);
  }
  iVar1 = *in_RCX;
  iVar2 = *in_RCX;
  uVar3 = *(ulong *)jump;
  *(ulong *)jump = uVar3 + 1;
  pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(count + 0xc),
                      (long)iVar2 + uVar3 % (ulong)*(uint *)((long)count + 0xc));
  other = std::vector<pm::Vector3,_std::allocator<pm::Vector3>_>::operator[]
                    ((vector<pm::Vector3,_std::allocator<pm::Vector3>_> *)(count + 9),
                     (ulong)(iVar1 + *pvVar6));
  Vector3::Vector3((Vector3 *)this,other);
  VVar7.z = in_XMM1_Da;
  VVar7.x = (float)(int)extraout_XMM0_Qa;
  VVar7.y = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  return VVar7;
}

Assistant:

Vector3 Sampler::sampleHemisphere(unsigned long &count, int &jump)
{
	// Start of a new pixel
	if (count % numSamples() == 0)
		jump = rnd_.integer(0, numSets_) * numSamples_;

	return hemisphereSamples_[jump + shuffledIndices_[jump + count++ % numSamples_]];
}